

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpx_rac.c
# Opt level: O0

int vpx_rac_get_uint(VpxRangeCoder *c,int bits)

{
  uint uVar1;
  undefined4 local_18;
  undefined4 local_14;
  int value;
  int bits_local;
  VpxRangeCoder *c_local;
  
  local_18 = 0;
  local_14 = bits;
  while (local_14 != 0) {
    uVar1 = vpx_rac_get(c);
    local_18 = local_18 << 1 | uVar1;
    local_14 = local_14 + -1;
  }
  return local_18;
}

Assistant:

int vpx_rac_get_uint(VpxRangeCoder *c, int bits)
{
    int value = 0;

    while (bits--) {
        value = (value << 1) | vpx_rac_get(c);
    }

    return value;
}